

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O1

int jas_image_encode(jas_image_t *image,jas_stream_t *out,int fmt,char *optstr)

{
  _func_int_jas_image_t_ptr_jas_stream_t_ptr_char_ptr *UNRECOVERED_JUMPTABLE;
  jas_image_fmtinfo_t *pjVar1;
  int iVar2;
  
  if (0 < jas_image_numfmts) {
    pjVar1 = jas_image_fmtinfos;
    iVar2 = jas_image_numfmts;
    do {
      if (pjVar1->id == fmt) goto LAB_001100ad;
      pjVar1 = pjVar1 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  pjVar1 = (jas_image_fmtinfo_t *)0x0;
LAB_001100ad:
  if (pjVar1 == (jas_image_fmtinfo_t *)0x0) {
    jas_eprintf("format lookup failed\n");
  }
  else {
    UNRECOVERED_JUMPTABLE = (pjVar1->ops).encode;
    if (UNRECOVERED_JUMPTABLE != (_func_int_jas_image_t_ptr_jas_stream_t_ptr_char_ptr *)0x0) {
      iVar2 = (*UNRECOVERED_JUMPTABLE)(image,out,optstr);
      return iVar2;
    }
  }
  return -1;
}

Assistant:

int jas_image_encode(jas_image_t *image, jas_stream_t *out, int fmt,
  const char *optstr)
{
	const jas_image_fmtinfo_t *fmtinfo;
	if (!(fmtinfo = jas_image_lookupfmtbyid(fmt))) {
		jas_eprintf("format lookup failed\n");
		return -1;
	}
	return (fmtinfo->ops.encode) ? (*fmtinfo->ops.encode)(image, out,
	  optstr) : (-1);
}